

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

int __thiscall
FOptionMenuItemOptionBase::Draw
          (FOptionMenuItemOptionBase *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  int iVar1;
  undefined4 extraout_var;
  Pair *pPVar2;
  EColorRange local_6c;
  byte local_55;
  FName local_54;
  FOptionValues **local_50;
  FOptionValues **opt;
  char *pcStack_40;
  int Selection;
  char *text;
  byte bStack_30;
  int overlay;
  byte local_22;
  byte local_21;
  int local_20;
  bool grayed;
  int iStack_1c;
  bool selected_local;
  int indent_local;
  int y_local;
  FOptionMenuDescriptor *desc_local;
  FOptionMenuItemOptionBase *this_local;
  
  local_55 = 0;
  local_21 = selected;
  local_20 = indent;
  iStack_1c = y;
  _indent_local = desc;
  desc_local = (FOptionMenuDescriptor *)this;
  if (this->mGrayCheck != (FBaseCVar *)0x0) {
    iVar1 = (*this->mGrayCheck->_vptr_FBaseCVar[4])(this->mGrayCheck,0);
    bStack_30 = (byte)iVar1;
    local_55 = bStack_30 ^ 0xff;
    _bStack_30 = CONCAT44(extraout_var,iVar1);
  }
  local_22 = local_55 & 1;
  if (this->mCenter != 0) {
    local_20 = DCanvas::GetWidth((DCanvas *)screen);
    local_20 = local_20 / 2;
  }
  if ((local_21 & 1) == 0) {
    local_6c = OptionSettings.mFontColor;
  }
  else {
    local_6c = OptionSettings.mFontColorSelection;
  }
  FOptionMenuItem::drawLabel
            (&this->super_FOptionMenuItem,local_20,iStack_1c,local_6c,(bool)(local_22 & 1));
  text._4_4_ = 0;
  if ((local_22 & 1) != 0) {
    text._4_4_ = 0x60300000;
  }
  opt._4_4_ = (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])();
  FName::FName(&local_54,(FName *)&(this->super_FOptionMenuItem).field_0x24);
  local_50 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
             CheckKey(&OptionValues,&local_54);
  if (((opt._4_4_ < 0) || (local_50 == (FOptionValues **)0x0)) ||
     (*local_50 == (FOptionValues *)0x0)) {
    pcStack_40 = "Unknown";
  }
  else {
    pPVar2 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[]
                       (&(*local_50)->mValues,(long)opt._4_4_);
    pcStack_40 = FString::operator_cast_to_char_(&pPVar2->Text);
  }
  if (*pcStack_40 == '$') {
    pcStack_40 = FStringTable::operator()(&GStrings,pcStack_40 + 1);
  }
  DCanvas::DrawText((DCanvas *)screen,SmallFont,OptionSettings.mFontColorValue,
                    local_20 + CleanXfac_1 * 0xe,iStack_1c,pcStack_40,0x40001394,1,0x400013aa,
                    text._4_4_,0);
  return local_20;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		bool grayed = mGrayCheck != NULL && !(mGrayCheck->GetGenericRep(CVAR_Bool).Bool);

		if (mCenter)
		{
			indent = (screen->GetWidth() / 2);
		}
		drawLabel(indent, y, selected? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, grayed);

		int overlay = grayed? MAKEARGB(96,48,0,0) : 0;
		const char *text;
		int Selection = GetSelection();
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (Selection < 0 || opt == NULL || *opt == NULL)
		{
			text = "Unknown";
		}
		else
		{
			text = (*opt)->mValues[Selection].Text;
		}
		if (*text == '$') text = GStrings(text + 1);
		screen->DrawText (SmallFont, OptionSettings.mFontColorValue, indent + CURSORSPACE, y, 
			text, DTA_CleanNoMove_1, true, DTA_ColorOverlay, overlay, TAG_DONE);
		return indent;
	}